

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O1

gdImagePtr gdImageCopyGaussianBlurred(gdImagePtr src,int radius,double sigma)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  double *coeffs;
  ulong uVar7;
  gdImagePtr dst;
  gdImagePtr dst_00;
  long lVar8;
  double dVar9;
  
  if (radius < 1) {
    return (gdImagePtr)0x0;
  }
  uVar1 = radius * 2 + 1;
  coeffs = (double *)gdMalloc((ulong)uVar1 * 8);
  if (coeffs == (double *)0x0) {
    coeffs = (double *)0x0;
  }
  else {
    dVar9 = 0.0;
    dVar3 = (double)(-(ulong)(sigma <= 0.0) & (ulong)((double)radius * 0.6666666666666666) |
                    ~-(ulong)(sigma <= 0.0) & (ulong)sigma);
    lVar8 = 0;
    do {
      iVar6 = (int)lVar8 - radius;
      dVar2 = exp((double)-(iVar6 * iVar6) / ((dVar3 + dVar3) * dVar3));
      dVar9 = dVar9 + dVar2;
      coeffs[((ulong)(uint)radius + lVar8) - (long)radius] = dVar2;
      lVar8 = lVar8 + 1;
    } while (uVar1 != (uint)lVar8);
    uVar7 = 0;
    do {
      coeffs[uVar7] = coeffs[uVar7] / dVar9;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  bVar5 = false;
  if (coeffs == (double *)0x0) {
    return (gdImagePtr)0x0;
  }
  if (src->trueColor != 0) goto LAB_0011519b;
  src = gdImageClone(src);
  if (src == (gdImagePtr)0x0) {
LAB_0011518b:
    gdFree(coeffs);
    bVar5 = false;
    bVar4 = false;
  }
  else {
    iVar6 = gdImagePaletteToTrueColor(src);
    if (iVar6 == 0) {
      gdImageDestroy(src);
      goto LAB_0011518b;
    }
    bVar4 = true;
    bVar5 = true;
  }
  if (!bVar4) {
    return (gdImagePtr)0x0;
  }
LAB_0011519b:
  dst = gdImageCreateTrueColor(src->sx,src->sy);
  if (dst == (gdImagePtr)0x0) {
    gdFree(coeffs);
    return (gdImagePtr)0x0;
  }
  applyCoeffs(src,dst,coeffs,radius,HORIZONTAL);
  dst_00 = gdImageCreateTrueColor(src->sx,src->sy);
  if (dst_00 != (gdImagePtr)0x0) {
    applyCoeffs(dst,dst_00,coeffs,radius,VERTICAL);
  }
  gdImageDestroy(dst);
  gdFree(coeffs);
  if (bVar5) {
    gdImageDestroy(src);
    return dst_00;
  }
  return dst_00;
}

Assistant:

BGD_DECLARE(gdImagePtr)
gdImageCopyGaussianBlurred(gdImagePtr src, int radius, double sigma)
{
    gdImagePtr tmp = NULL, result = NULL;
    double *coeffs;
    int freeSrc = 0;

    if (radius < 1) {
        return NULL;
    }/* if */

    /* Compute the coefficients. */
    coeffs = gaussian_coeffs(radius, sigma);
    if (!coeffs) {
        return NULL;
    }/* if */

    /* If the image is not truecolor, we first make a truecolor
     * scratch copy. */
	if (!src->trueColor) {
        int tcstat;

        src = gdImageClone(src);
        if (!src) {
			gdFree(coeffs);
			return NULL;
		}

        tcstat = gdImagePaletteToTrueColor(src);
        if (!tcstat) {
            gdImageDestroy(src);
			gdFree(coeffs);
            return NULL;
        }/* if */
		
        freeSrc = 1;
	}/* if */

    /* Apply the filter horizontally. */
    tmp = gdImageCreateTrueColor(src->sx, src->sy);
    if (!tmp) {
		gdFree(coeffs);
		return NULL;
	}
    applyCoeffs(src, tmp, coeffs, radius, HORIZONTAL);

    /* Apply the filter vertically. */
    result = gdImageCreateTrueColor(src->sx, src->sy);
    if (result) {
        applyCoeffs(tmp, result, coeffs, radius, VERTICAL);
    }/* if */

    gdImageDestroy(tmp);
    gdFree(coeffs);

    if (freeSrc) gdImageDestroy(src);

    return result;
}